

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_poc_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  void *pvVar4;
  int local_48;
  byte local_3d;
  int local_3c;
  uint_fast8_t tmp;
  uint_fast8_t *puStack_38;
  int pchgno;
  jpc_pocpchg_t *pchg;
  jpc_poc_t *poc;
  jas_stream_t *in_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  pchg = (jpc_pocpchg_t *)&ms->parms;
  if (cstate->numcomps < 0x101) {
    local_48 = (int)(ms->len / 7);
  }
  else {
    local_48 = (int)(ms->len / 9);
  }
  *(int *)pchg = local_48;
  poc = (jpc_poc_t *)in;
  in_local = (jas_stream_t *)cstate;
  cstate_local = (jpc_cstate_t *)ms;
  pvVar4 = jas_alloc2((long)*(int *)pchg,0x20);
  pchg->compnostart = (uint_fast16_t)pvVar4;
  if (pvVar4 == (void *)0x0) {
LAB_00128525:
    jpc_poc_destroyparms((jpc_ms_t *)cstate_local);
    ms_local._4_4_ = -1;
  }
  else {
    local_3c = 0;
    puStack_38 = (uint_fast8_t *)pchg->compnostart;
    for (; iVar3._0_1_ = pchg->prgord, iVar3._1_1_ = pchg->rlvlnostart,
        iVar3._2_1_ = pchg->rlvlnoend, iVar3._3_1_ = pchg->field_0x3, local_3c < iVar3;
        local_3c = local_3c + 1) {
      iVar3 = jpc_getuint8((jas_stream_t *)poc,puStack_38 + 1);
      if (iVar3 != 0) goto LAB_00128525;
      uVar1._0_4_ = in_local->openmode_;
      uVar1._4_4_ = in_local->bufmode_;
      if (uVar1 < 0x101) {
        iVar3 = jpc_getuint8((jas_stream_t *)poc,&local_3d);
        if (iVar3 != 0) goto LAB_00128525;
        *(ulong *)(puStack_38 + 8) = (ulong)local_3d;
      }
      else {
        iVar3 = jpc_getuint16((jas_stream_t *)poc,(uint_fast16_t *)(puStack_38 + 8));
        if (iVar3 != 0) goto LAB_00128525;
      }
      iVar3 = jpc_getuint16((jas_stream_t *)poc,(uint_fast16_t *)(puStack_38 + 0x18));
      if ((iVar3 != 0) || (iVar3 = jpc_getuint8((jas_stream_t *)poc,puStack_38 + 2), iVar3 != 0))
      goto LAB_00128525;
      uVar2._0_4_ = in_local->openmode_;
      uVar2._4_4_ = in_local->bufmode_;
      if (uVar2 < 0x101) {
        iVar3 = jpc_getuint8((jas_stream_t *)poc,&local_3d);
        if (iVar3 != 0) goto LAB_00128525;
        *(ulong *)(puStack_38 + 0x10) = (ulong)local_3d;
      }
      else {
        iVar3 = jpc_getuint16((jas_stream_t *)poc,(uint_fast16_t *)(puStack_38 + 0x10));
        if (iVar3 != 0) goto LAB_00128525;
      }
      iVar3 = jpc_getuint8((jas_stream_t *)poc,puStack_38);
      if (((iVar3 != 0) || (puStack_38[2] < puStack_38[1])) ||
         (*(ulong *)(puStack_38 + 0x10) < *(ulong *)(puStack_38 + 8))) goto LAB_00128525;
      puStack_38 = puStack_38 + 0x20;
    }
    ms_local._4_4_ = 0;
  }
  return ms_local._4_4_;
}

Assistant:

static int jpc_poc_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_poc_t *poc = &ms->parms.poc;
	jpc_pocpchg_t *pchg;
	int pchgno;
	uint_fast8_t tmp;
	poc->numpchgs = (cstate->numcomps > 256) ? (ms->len / 9) :
	  (ms->len / 7);
	if (!(poc->pchgs = jas_alloc2(poc->numpchgs, sizeof(jpc_pocpchg_t)))) {
		goto error;
	}
	for (pchgno = 0, pchg = poc->pchgs; pchgno < poc->numpchgs; ++pchgno,
	  ++pchg) {
		if (jpc_getuint8(in, &pchg->rlvlnostart)) {
			goto error;
		}
		if (cstate->numcomps > 256) {
			if (jpc_getuint16(in, &pchg->compnostart)) {
				goto error;
			}
		} else {
			if (jpc_getuint8(in, &tmp)) {
				goto error;
			};
			pchg->compnostart = tmp;
		}
		if (jpc_getuint16(in, &pchg->lyrnoend) ||
		  jpc_getuint8(in, &pchg->rlvlnoend)) {
			goto error;
		}
		if (cstate->numcomps > 256) {
			if (jpc_getuint16(in, &pchg->compnoend)) {
				goto error;
			}
		} else {
			if (jpc_getuint8(in, &tmp)) {
				goto error;
			}
			pchg->compnoend = tmp;
		}
		if (jpc_getuint8(in, &pchg->prgord)) {
			goto error;
		}
		if (pchg->rlvlnostart > pchg->rlvlnoend ||
		  pchg->compnostart > pchg->compnoend) {
			goto error;
		}
	}
	return 0;

error:
	jpc_poc_destroyparms(ms);
	return -1;
}